

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O2

ssize_t __thiscall
sc_core::vcd_sc_signed_trace::write(vcd_sc_signed_trace *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  sc_signed_bitref_r *this_00;
  sc_signed *psVar5;
  int iVar6;
  undefined4 in_register_00000034;
  size_type __n_00;
  char *pcVar7;
  allocator_type local_4a;
  allocator_type local_49;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  if ((write(_IO_FILE*)::compdata == '\0') &&
     (iVar6 = __cxa_guard_acquire(&write(_IO_FILE*)::compdata), iVar6 != 0)) {
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_48._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&write::compdata,0x400,(value_type_conflict *)&local_48,&local_4a);
    __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::compdata,&__dso_handle);
    __cxa_guard_release(&write(_IO_FILE*)::compdata);
  }
  if ((write(_IO_FILE*)::rawdata == '\0') &&
     (iVar6 = __cxa_guard_acquire(&write(_IO_FILE*)::rawdata), iVar6 != 0)) {
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_48._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&write::rawdata,0x400,(value_type_conflict *)&local_48,&local_4a);
    __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::rawdata,&__dso_handle);
    __cxa_guard_release(&write(_IO_FILE*)::rawdata);
  }
  iVar6 = this->object->nbits;
  pcVar7 = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) <= (ulong)(long)iVar6) {
    __n_00 = ((long)iVar6 & 0xfffffffffffff000U) + 0x1000;
    local_4a = (allocator_type)0x0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_48,__n_00,
               (value_type_conflict *)&local_4a,&local_49);
    pcVar3 = local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar2 = local_48._M_impl.super__Vector_impl_data._M_finish;
    pcVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
         write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start =
         write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_finish =
         write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar1;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar3;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
    local_4a = (allocator_type)0x0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_48,__n_00,
               (value_type_conflict *)&local_4a,&local_49);
    pcVar3 = local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar2 = local_48._M_impl.super__Vector_impl_data._M_finish;
    pcVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
         write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start =
         write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_finish =
         write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar1;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar3;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
    iVar6 = this->object->nbits;
    pcVar7 = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  while (0 < iVar6) {
    iVar6 = iVar6 + -1;
    this_00 = sc_dt::sc_signed::operator[](this->object,iVar6);
    bVar4 = sc_dt::sc_signed_bitref_r::to_bool(this_00);
    *pcVar7 = "01"[bVar4];
    pcVar7 = pcVar7 + 1;
  }
  *pcVar7 = '\0';
  vcd_trace::compose_data_line
            (&this->super_vcd_trace,
             write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  fputs(write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start,(FILE *)CONCAT44(in_register_00000034,__fd));
  psVar5 = sc_dt::sc_signed::operator=(&this->old_value,this->object);
  return (ssize_t)psVar5;
}

Assistant:

void
vcd_sc_signed_trace::write(FILE* f)
{
    static std::vector<char> compdata(1024), rawdata(1024);
    typedef std::vector<char>::size_type size_t;

    if ( compdata.size() <= static_cast<size_t>(object.length()) ) { // include trailing \0
        size_t sz = ( static_cast<size_t>(object.length()) + 4096 ) & (~static_cast<size_t>(4096-1));
        std::vector<char>( sz ).swap( compdata ); // resize without copying values
        std::vector<char>( sz ).swap( rawdata );
    }
    char *rawdata_ptr  = &rawdata[0];

    for (int bitindex = object.length() - 1; bitindex >= 0; --bitindex) {
        *rawdata_ptr++ = "01"[object[bitindex].to_bool()];
    }
    *rawdata_ptr = '\0';
    compose_data_line(&rawdata[0], &compdata[0]);

    std::fputs(&compdata[0], f);
    old_value = object;
}